

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_thrust_damage_one(wchar_t i)

{
  bitflag *flags;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  monster_race *pmVar5;
  borg_kill *pbVar6;
  borg_item_conflict *pbVar7;
  _Bool _Var8;
  int iVar9;
  int iVar10;
  bitflag *flags_00;
  int iVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  int iVar14;
  
  pbVar7 = borg_items;
  pbVar6 = borg_kills;
  pmVar5 = r_info;
  uVar3 = borg_kills[(uint)i].r_idx;
  wVar13 = L'\0';
  if ((int)(uint)uVar3 < (int)(z_info->r_max - 1)) {
    uVar4 = z_info->pack_size;
    bVar1 = borg_items[uVar4].dd;
    bVar2 = borg_items[uVar4].ds;
    if (((borg.trait[0xc1] != 0) &&
        (_Var8 = flag_has_dbg(r_info[uVar3].flags,0xb,0x3c,"r_ptr->flags","RF_ANIMAL"), _Var8)) ||
       ((iVar14 = 1, borg.trait[0xc2] != 0 &&
        (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL"), _Var8)))) {
      iVar14 = 2;
    }
    if ((((((((borg.trait[0xc3] != 0) &&
             (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD"), _Var8))
            || ((borg.trait[0xc4] != 0 &&
                (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3b,"r_ptr->flags","RF_DEMON"), _Var8
                )))) ||
           ((borg.trait[0xc5] != 0 &&
            (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x37,"r_ptr->flags","RF_ORC"), _Var8))))
          || ((borg.trait[0xc6] != 0 &&
              (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x38,"r_ptr->flags","RF_TROLL"), _Var8))
             )) || ((((borg.trait[199] != 0 &&
                      (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x39,"r_ptr->flags","RF_GIANT"),
                      _Var8)) ||
                     ((borg.trait[200] != 0 &&
                      (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3a,"r_ptr->flags","RF_DRAGON")
                      , _Var8)))) ||
                    ((borg.trait[0xcd] != 0 &&
                     (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x45,"r_ptr->flags","RF_IM_ACID")
                     , !_Var8)))))) ||
        ((borg.trait[0xcf] != 0 &&
         (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x47,"r_ptr->flags","RF_IM_FIRE"), !_Var8))))
       || ((((borg.trait[0xd0] != 0 &&
             (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x48,"r_ptr->flags","RF_IM_COLD"), !_Var8
             )) || ((borg.trait[0xd1] != 0 &&
                    (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x49,"r_ptr->flags","RF_IM_POIS"),
                    !_Var8)))) ||
           ((borg.trait[0xce] != 0 &&
            (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x46,"r_ptr->flags","RF_IM_ELEC"), !_Var8)
            ))))) {
      iVar14 = 3;
    }
    if ((((borg.trait[0xc9] != 0) &&
         (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD"), _Var8)) ||
        ((borg.trait[0xca] != 0 &&
         (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3b,"r_ptr->flags","RF_DEMON"), _Var8)))) ||
       ((borg.trait[0xcb] != 0 &&
        (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,0x3a,"r_ptr->flags","RF_DRAGON"), _Var8)))) {
      iVar14 = 5;
    }
    iVar11 = ((int)pbVar7[uVar4].to_h + borg.trait[0x86]) * 3 + borg.trait[0x3c];
    iVar10 = pmVar5[uVar3].ac * 3;
    iVar9 = pmVar5[uVar3].ac * 3 + 3;
    if (-1 < iVar10) {
      iVar9 = iVar10;
    }
    iVar10 = 0;
    if ((int)(iVar9 * 2 & 0xfffffff8U) / 10 <= iVar11) {
      iVar10 = ((int)pbVar7[uVar4].to_d + iVar14 * ((bVar2 + 1) * (uint)bVar1 >> 1) +
               borg.trait[0x87]) * borg.trait[0x92];
    }
    iVar14 = 0x5f;
    if (iVar11 < 0x5f) {
      iVar14 = iVar11;
    }
    iVar9 = 5;
    if (5 < iVar14) {
      iVar9 = iVar14;
    }
    iVar14 = iVar9 + 10;
    if (borg.trait[0x23] < 0x10) {
      iVar14 = iVar9;
    }
    if (((borg.trait[0x19] == 4) || (iVar9 = iVar14, borg.trait[0x19] == 1)) &&
       (iVar9 = iVar14 + -10, borg.trait[0x1e] < 2)) {
      iVar9 = iVar14;
    }
    wVar13 = (iVar9 * iVar10) / 100;
    wVar12 = L'\x01';
    if (L'\x01' < wVar13) {
      wVar12 = wVar13;
    }
    if ((pbVar6[(uint)i].power * 2 < wVar12) &&
       (_Var8 = flag_has_dbg(pmVar5[uVar3].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var8)) {
      wVar12 = pbVar6[(uint)i].power * 2;
    }
    if (((borg.trait[0x19] == 4) || (borg.trait[0x19] == 1)) &&
       ((borg.trait[0x24] < 0x28 && (1 < borg.trait[0x1e])))) {
      wVar12 = (wVar12 << 3) / 10 + L'\x01';
    }
    flags = pmVar5[uVar3].flags;
    _Var8 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar13 = wVar12;
    if ((_Var8) && (wVar13 = wVar12 * 6, borg.trait[0x69] < 1)) {
      wVar13 = wVar12;
    }
    _Var8 = flag_has_dbg(flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar12 = wVar13;
    if ((_Var8) && (borg.trait[0x69] == 0)) {
      wVar12 = L'\0';
      if (4 < borg.trait[0x23]) {
        wVar12 = (wVar13 * 2) / 3;
      }
    }
    _Var8 = flag_has_dbg(flags,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
    if (_Var8) {
      wVar12 = (wVar12 * 3) / 2;
    }
    flags_00 = pmVar5[uVar3].spell_flags;
    _Var8 = flag_has_dbg(flags_00,0xc,0x4c,"r_ptr->spell_flags","RSF_S_KIN");
    if (((((((_Var8) ||
            (_Var8 = flag_has_dbg(flags_00,0xc,0x4d,"r_ptr->spell_flags","RSF_S_HI_DEMON"), _Var8))
           || (_Var8 = flag_has_dbg(flags_00,0xc,0x4e,"r_ptr->spell_flags","RSF_S_MONSTER"), _Var8))
          || ((_Var8 = flag_has_dbg(flags_00,0xc,0x4f,"r_ptr->spell_flags","RSF_S_MONSTERS"), _Var8
              || (_Var8 = flag_has_dbg(flags_00,0xc,0x50,"r_ptr->spell_flags","RSF_S_ANIMAL"), _Var8
                 )))) ||
         ((_Var8 = flag_has_dbg(flags_00,0xc,0x51,"r_ptr->spell_flags","RSF_S_SPIDER"), _Var8 ||
          ((_Var8 = flag_has_dbg(flags_00,0xc,0x52,"r_ptr->spell_flags","RSF_S_HOUND"), _Var8 ||
           (_Var8 = flag_has_dbg(flags_00,0xc,0x53,"r_ptr->spell_flags","RSF_S_HYDRA"), _Var8))))))
        || (_Var8 = flag_has_dbg(flags_00,0xc,0x54,"r_ptr->spell_flags","RSF_S_AINU"), _Var8)) ||
       ((((_Var8 = flag_has_dbg(flags_00,0xc,0x55,"r_ptr->spell_flags","RSF_S_DEMON"), _Var8 ||
          (_Var8 = flag_has_dbg(flags_00,0xc,0x56,"r_ptr->spell_flags","RSF_S_UNDEAD"), _Var8)) ||
         (_Var8 = flag_has_dbg(flags_00,0xc,0x57,"r_ptr->spell_flags","RSF_S_DRAGON"), _Var8)) ||
        (((_Var8 = flag_has_dbg(flags_00,0xc,0x58,"r_ptr->spell_flags","RSF_S_HI_UNDEAD"), _Var8 ||
          (_Var8 = flag_has_dbg(flags_00,0xc,0x5a,"r_ptr->spell_flags","RSF_S_WRAITH"), _Var8)) ||
         (_Var8 = flag_has_dbg(flags_00,0xc,0x5b,"r_ptr->spell_flags","RSF_S_UNIQUE"), _Var8)))))) {
      wVar12 = (wVar12 * 3) / 2 + wVar12;
    }
    _Var8 = flag_has_dbg(flags,0xb,2,"r_ptr->flags","RF_QUESTOR");
    wVar13 = wVar12 * 6;
    if (!_Var8) {
      wVar13 = wVar12;
    }
  }
  return wVar13;
}

Assistant:

static int borg_thrust_damage_one(int i)
{
    int dam;
    int mult;

    borg_kill *kill;

    struct monster_race *r_ptr;

    borg_item *item;

    int chance;

    /* Examine current weapon */
    item = &borg_items[INVEN_WIELD];

    /* Monster record */
    kill = &borg_kills[i];

    /* Monster race */
    r_ptr = &r_info[kill->r_idx];

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 0;

    /* Damage */
    dam = (item->dd * (item->ds + 1) / 2);

    /* here is the place for slays and such */
    mult = 1;

    if (((borg.trait[BI_WS_ANIMAL]) && (rf_has(r_ptr->flags, RF_ANIMAL)))
        || ((borg.trait[BI_WS_EVIL]) && (rf_has(r_ptr->flags, RF_EVIL))))
        mult = 2;
    if (((borg.trait[BI_WS_UNDEAD]) && (rf_has(r_ptr->flags, RF_UNDEAD)))
        || ((borg.trait[BI_WS_DEMON]) && (rf_has(r_ptr->flags, RF_DEMON)))
        || ((borg.trait[BI_WS_ORC]) && (rf_has(r_ptr->flags, RF_ORC)))
        || ((borg.trait[BI_WS_TROLL]) && (rf_has(r_ptr->flags, RF_TROLL)))
        || ((borg.trait[BI_WS_GIANT]) && (rf_has(r_ptr->flags, RF_GIANT)))
        || ((borg.trait[BI_WS_DRAGON]) && (rf_has(r_ptr->flags, RF_DRAGON)))
        || ((borg.trait[BI_WB_ACID]) && !(rf_has(r_ptr->flags, RF_IM_ACID)))
        || ((borg.trait[BI_WB_FIRE]) && !(rf_has(r_ptr->flags, RF_IM_FIRE)))
        || ((borg.trait[BI_WB_COLD]) && !(rf_has(r_ptr->flags, RF_IM_COLD)))
        || ((borg.trait[BI_WB_POIS]) && !(rf_has(r_ptr->flags, RF_IM_POIS)))
        || ((borg.trait[BI_WB_ELEC]) && !(rf_has(r_ptr->flags, RF_IM_ELEC))))
        mult = 3;
    if (((borg.trait[BI_WK_UNDEAD]) && (rf_has(r_ptr->flags, RF_UNDEAD)))
        || ((borg.trait[BI_WK_DEMON]) && (rf_has(r_ptr->flags, RF_DEMON)))
        || ((borg.trait[BI_WK_DRAGON]) && (rf_has(r_ptr->flags, RF_DRAGON))))
        mult = 5;

    /* add the multiplier */
    dam *= mult;

    /* add weapon bonuses */
    dam += item->to_d;

    /* add player bonuses */
    dam += borg.trait[BI_TODAM];

    /* multiply the damage for the whole round of attacks */
    dam *= borg.trait[BI_BLOWS];

    /* Bonuses for combat */
    chance = (borg.trait[BI_THN] + ((borg.trait[BI_TOHIT] + item->to_h) * 3));

    /* Chance of hitting the monsters AC */
    if (chance < (r_ptr->ac * 3 / 4) * 8 / 10)
        dam = 0;

    /* 5% automatic success/fail */
    if (chance > 95)
        chance = 95;
    if (chance < 5)
        chance = 5;

    /* add 10% to chance to give a bit more weight to weapons */
    if (borg.trait[BI_CLEVEL] > 15)
        chance += 10;

    /* Mages with Mana do not get that bonus, they should cast */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        && borg.trait[BI_CURSP] > 1)
        chance -= 10;

    /* reduce damage by the % chance to hit */
    dam = (dam * chance) / 100;

    /* Try to place a minimal amount of damage */
    if (dam <= 0)
        dam = 1;

    /* Limit damage to twice maximal hitpoints */
    if (dam > kill->power * 2 && !rf_has(r_ptr->flags, RF_UNIQUE))
        dam = kill->power * 2;

    /*
     * Reduce the damage if a mage, they should not melee if they can avoid it
     */
    if ((borg.trait[BI_CLASS] == CLASS_MAGE
            || borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        && borg.trait[BI_MAXCLEVEL] < 40 && borg.trait[BI_CURSP] > 1)
        dam = (dam * 8 / 10) + 1;

    /*
     * Enhance the perceived damage on Uniques.  This way we target them
     * Keep in mind that he should hit the uniques but if he has a
     * x5 great bane of dragons, he will tend attack the dragon since the
     * perceived (and actual) damage is higher.  But don't select
     * the town uniques (maggot does no damage)
     *
     */
    if ((rf_has(r_ptr->flags, RF_UNIQUE)) && borg.trait[BI_CDEPTH] >= 1)
        dam += (dam * 5);

    /* Hack -- ignore Maggot until later.  Player will chase Maggot
     * down all across the screen waking up all the monsters.  Then
     * he is stuck in a compromised situation.
     */
    if ((rf_has(r_ptr->flags, RF_UNIQUE)) && borg.trait[BI_CDEPTH] == 0) {
        dam = dam * 2 / 3;

        /* Dont hunt maggot until later */
        if (borg.trait[BI_CLEVEL] < 5)
            dam = 0;
    }

    /* give a small bonus for whacking a breeder */
    if (rf_has(r_ptr->flags, RF_MULTIPLY))
        dam = (dam * 3 / 2);

    /* Enhance the perceived damage to summoner in order to influence the
     * choice of targets.
     */
    if ((rsf_has(r_ptr->spell_flags, RSF_S_KIN))
        || (rsf_has(r_ptr->spell_flags, RSF_S_HI_DEMON))
        || (rsf_has(r_ptr->spell_flags, RSF_S_MONSTER))
        || (rsf_has(r_ptr->spell_flags, RSF_S_MONSTERS))
        || (rsf_has(r_ptr->spell_flags, RSF_S_ANIMAL))
        || (rsf_has(r_ptr->spell_flags, RSF_S_SPIDER))
        || (rsf_has(r_ptr->spell_flags, RSF_S_HOUND))
        || (rsf_has(r_ptr->spell_flags, RSF_S_HYDRA))
        || (rsf_has(r_ptr->spell_flags, RSF_S_AINU))
        || (rsf_has(r_ptr->spell_flags, RSF_S_DEMON))
        || (rsf_has(r_ptr->spell_flags, RSF_S_UNDEAD))
        || (rsf_has(r_ptr->spell_flags, RSF_S_DRAGON))
        || (rsf_has(r_ptr->spell_flags, RSF_S_HI_UNDEAD))
        || (rsf_has(r_ptr->spell_flags, RSF_S_WRAITH))
        || (rsf_has(r_ptr->spell_flags, RSF_S_UNIQUE)))
        dam += ((dam * 3) / 2);

    /*
     * Apply massive damage bonus to Questor monsters to
     * encourage borg to strike them.
     */
    if (rf_has(r_ptr->flags, RF_QUESTOR))
        dam += (dam * 5);

    /* Damage */
    return dam;
}